

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Server_processBinaryMessage
               (UA_Server *server,UA_Connection *connection,UA_ByteString *message)

{
  UA_Logger logger;
  UA_StatusCode UVar1;
  uint uVar2;
  char *pcVar3;
  size_t local_a0;
  size_t tmpPos;
  UA_ByteString ack_msg;
  UA_TcpMessageHeader local_80;
  UA_TcpMessageHeader ackHeader;
  UA_TcpMessageHeader tcpMessageHeader;
  UA_TcpErrorMessage errorMessage;
  UA_UInt32 local_44;
  UA_UInt32 local_40;
  UA_TcpAcknowledgeMessage ackMessage;
  size_t offset;
  
  if (connection->channel != (UA_SecureChannel *)0x0) {
    UVar1 = UA_SecureChannel_processChunks
                      (connection->channel,message,UA_Server_processSecureChannelMessage,server);
    if (UVar1 == 0) {
      return;
    }
    UA_StatusCode_name(UVar1);
    return;
  }
  ackMessage.maxMessageSize = 0;
  ackMessage.maxChunkCount = 0;
  UVar1 = UA_TcpMessageHeader_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&ackHeader);
  if ((UVar1 == 0) && (uVar2 = ackHeader.messageTypeAndChunkType & 0xffffff, uVar2 != 0x47534d)) {
    if (uVar2 == 0x4c4548) {
      UVar1 = UA_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&tcpMessageHeader,
                              UA_TRANSPORT + 2);
      if (UVar1 == 0) {
        (connection->remoteConf).maxChunkCount = (UA_UInt32)errorMessage.reason.length;
        (connection->remoteConf).maxMessageSize = errorMessage._4_4_;
        (connection->remoteConf).protocolVersion = tcpMessageHeader.messageTypeAndChunkType;
        (connection->remoteConf).recvBufferSize = tcpMessageHeader.messageSize;
        if (tcpMessageHeader.messageSize < (connection->localConf).sendBufferSize) {
          (connection->localConf).sendBufferSize = tcpMessageHeader.messageSize;
        }
        (connection->remoteConf).sendBufferSize = errorMessage.error;
        if (errorMessage.error < (connection->localConf).recvBufferSize) {
          (connection->localConf).recvBufferSize = errorMessage.error;
        }
        connection->state = UA_CONNECTION_ESTABLISHED;
        UA_TcpHelloMessage_deleteMembers((UA_TcpHelloMessage *)&tcpMessageHeader);
        local_44 = (connection->localConf).protocolVersion;
        local_40 = (connection->localConf).recvBufferSize;
        ackMessage.protocolVersion = (connection->localConf).sendBufferSize;
        ackMessage.receiveBufferSize = (connection->localConf).maxMessageSize;
        ackMessage.sendBufferSize = (connection->localConf).maxChunkCount;
        local_80.messageTypeAndChunkType = 0x464b4341;
        local_80.messageSize = 0x1c;
        tmpPos = 0;
        ack_msg.length = 0;
        UVar1 = (*connection->getSendBuffer)
                          (connection,(ulong)ackMessage.protocolVersion,(UA_ByteString *)&tmpPos);
        if (UVar1 != 0) {
          return;
        }
        local_a0 = 0;
        UA_TcpMessageHeader_encodeBinary(&local_80,(UA_ByteString *)&tmpPos,&local_a0);
        UA_encodeBinary(&local_44,UA_TRANSPORT + 6,(UA_exchangeEncodeBuffer)0x0,(void *)0x0,
                        (UA_ByteString *)&tmpPos,&local_a0);
        tmpPos = (ulong)local_80 >> 0x20;
        (*connection->send)(connection,(UA_ByteString *)&tmpPos);
        return;
      }
    }
    else {
      if (uVar2 == 0x4e504f) {
        local_44 = 0;
        UVar1 = UA_UInt32_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&local_44);
        if (UVar1 != 0) {
          (*connection->close)(connection);
        }
        tcpMessageHeader = (UA_TcpMessageHeader)(message->length - 0xc);
        processOPN(server,connection,local_44,(UA_ByteString *)&tcpMessageHeader);
        return;
      }
      if (((uVar2 != 0x4f4c43) && (uVar2 == 0x525245)) &&
         (UVar1 = UA_TcpErrorMessage_decodeBinary
                            (message,(size_t *)&ackMessage.maxMessageSize,
                             (UA_TcpErrorMessage *)&tcpMessageHeader), UVar1 == 0)) {
        logger = (server->config).logger;
        pcVar3 = UA_StatusCode_name(tcpMessageHeader.messageTypeAndChunkType);
        UA_LOG_ERROR(logger,UA_LOGCATEGORY_NETWORK,"Client replied with an error message: %s %.*s",
                     pcVar3,errorMessage._0_8_,
                     CONCAT44(errorMessage.reason.length._4_4_,(UA_UInt32)errorMessage.reason.length
                             ));
        return;
      }
    }
  }
  (*connection->close)(connection);
  return;
}

Assistant:

void
UA_Server_processBinaryMessage(UA_Server *server, UA_Connection *connection,
                               const UA_ByteString *message) {
    UA_SecureChannel *channel = connection->channel;
    if(channel) {
        /* Assemble chunks in the securechannel and process complete messages */
        UA_StatusCode retval = 
            UA_SecureChannel_processChunks(channel, message,
                 (UA_ProcessMessageCallback*)UA_Server_processSecureChannelMessage, server);
        if(retval != UA_STATUSCODE_GOOD)
            UA_LOG_TRACE_CHANNEL(server->config.logger, channel, "Procesing chunks "
                                 "resulted in error code %s", UA_StatusCode_name(retval));
    } else {
        /* Process messages without a channel and no chunking */
        size_t offset = 0;
        UA_TcpMessageHeader tcpMessageHeader;
        UA_StatusCode retval = UA_TcpMessageHeader_decodeBinary(message, &offset, &tcpMessageHeader);
        if(retval != UA_STATUSCODE_GOOD) {
            connection->close(connection);
            return;
        }

        /* Dispatch according to the message type */
        switch(tcpMessageHeader.messageTypeAndChunkType & 0x00ffffff) {
        case UA_MESSAGETYPE_ERR:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process ERR message", connection->sockfd);
            processERR(server, connection, message, &offset);
            break;
        case UA_MESSAGETYPE_HEL:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process HEL message", connection->sockfd);
            processHEL(connection, message, &offset);
            break;
        case UA_MESSAGETYPE_OPN: {
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process OPN message", connection->sockfd);
            UA_UInt32 channelId = 0;
            retval = UA_UInt32_decodeBinary(message, &offset, &channelId);
            if(retval != UA_STATUSCODE_GOOD)
                connection->close(connection);
            UA_ByteString offsetMessage = (UA_ByteString){
                .data = message->data + 12, .length = message->length - 12};
            processOPN(server, connection, channelId, &offsetMessage);
            break; }
        case UA_MESSAGETYPE_MSG:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a MSG message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        case UA_MESSAGETYPE_CLO:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a CLO message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        default:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Unknown message type", connection->sockfd);
            connection->close(connection);
        }
    }
}